

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall
CTPNSym::gen_code_member
          (CTPNSym *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs,
          CTcNamedArgs *named_args)

{
  CTcPrsSymtab *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  this_00 = G_cs->symtab_;
  iVar1 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xc])();
  iVar2 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xd])(this);
  pCVar3 = CTcPrsSymtab::find_or_def
                     (this_00,(textchar_t *)CONCAT44(extraout_var,iVar1),
                      CONCAT44(extraout_var_00,iVar2),0,TCPRS_UNDEF_ADD_UNDEF);
  (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1e])
            (pCVar3,(ulong)(uint)discard,prop_expr,(ulong)(uint)prop_is_expr,argc,
             (ulong)(uint)varargs);
  return;
}

Assistant:

void CTPNSym::gen_code_member(int discard, CTcPrsNode *prop_expr,
                              int prop_is_expr,
                              int argc, int varargs, CTcNamedArgs *named_args)
{
    /* 
     *   Look up the symbol, and let it do the work.  There's no
     *   appropriate default for the symbol, so leave it undefined if we
     *   can't find it. 
     */
    G_cs->get_symtab()
        ->find_or_def_undef(get_sym_text(), get_sym_text_len(), FALSE)
        ->gen_code_member(discard, prop_expr, prop_is_expr,
                          argc, varargs, named_args);
}